

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O3

void __thiscall TTD::InflateMap::InflateMap(InflateMap *this)

{
  (this->m_handlerMap).m_h1Prime = 0;
  (this->m_handlerMap).m_h2Prime = 0;
  (this->m_handlerMap).m_capacity = 0;
  (this->m_handlerMap).m_hashArray = (Entry *)0x0;
  (this->m_handlerMap).m_count = 0;
  (this->m_typeMap).m_h1Prime = 0;
  (this->m_typeMap).m_h2Prime = 0;
  (this->m_typeMap).m_capacity = 0;
  (this->m_typeMap).m_hashArray = (Entry *)0x0;
  (this->m_typeMap).m_count = 0;
  (this->m_tagToGlobalObjectMap).m_h1Prime = 0;
  (this->m_tagToGlobalObjectMap).m_h2Prime = 0;
  (this->m_tagToGlobalObjectMap).m_capacity = 0;
  (this->m_tagToGlobalObjectMap).m_hashArray = (Entry *)0x0;
  (this->m_tagToGlobalObjectMap).m_count = 0;
  (this->m_objectMap).m_h1Prime = 0;
  (this->m_objectMap).m_h2Prime = 0;
  (this->m_objectMap).m_capacity = 0;
  (this->m_objectMap).m_hashArray = (Entry *)0x0;
  (this->m_objectMap).m_count = 0;
  (this->m_functionBodyMap).m_h1Prime = 0;
  (this->m_functionBodyMap).m_h2Prime = 0;
  (this->m_functionBodyMap).m_capacity = 0;
  (this->m_functionBodyMap).m_hashArray = (Entry *)0x0;
  (this->m_functionBodyMap).m_count = 0;
  (this->m_environmentMap).m_h1Prime = 0;
  (this->m_environmentMap).m_h2Prime = 0;
  (this->m_environmentMap).m_capacity = 0;
  (this->m_environmentMap).m_hashArray = (Entry *)0x0;
  (this->m_environmentMap).m_count = 0;
  (this->m_slotArrayMap).m_h1Prime = 0;
  (this->m_slotArrayMap).m_h2Prime = 0;
  (this->m_slotArrayMap).m_capacity = 0;
  (this->m_slotArrayMap).m_hashArray = (Entry *)0x0;
  (this->m_slotArrayMap).m_count = 0;
  (this->m_debuggerScopeHomeBodyMap).m_h1Prime = 0;
  (this->m_debuggerScopeHomeBodyMap).m_h2Prime = 0;
  (this->m_debuggerScopeHomeBodyMap).m_capacity = 0;
  (this->m_debuggerScopeHomeBodyMap).m_hashArray = (Entry *)0x0;
  (this->m_debuggerScopeHomeBodyMap).m_count = 0;
  (this->m_debuggerScopeChainIndexMap).m_h1Prime = 0;
  (this->m_debuggerScopeChainIndexMap).m_h2Prime = 0;
  (this->m_debuggerScopeChainIndexMap).m_capacity = 0;
  (this->m_debuggerScopeChainIndexMap).m_hashArray = (Entry *)0x0;
  (this->m_debuggerScopeChainIndexMap).m_count = 0;
  (this->m_promiseDataMap).buckets = (Type)0x0;
  (this->m_promiseDataMap).entries = (Type)0x0;
  (this->m_promiseDataMap).alloc = &Memory::HeapAllocator::Instance;
  (this->m_promiseDataMap).size = 0;
  (this->m_promiseDataMap).bucketCount = 0;
  (this->m_promiseDataMap).count = 0;
  (this->m_promiseDataMap).freeCount = 0;
  (this->m_promiseDataMap).modFunctionIndex = 0x4b;
  (this->m_oldObjectMap).m_hashArray = (Entry *)0x0;
  (this->m_oldObjectMap).m_count = 0;
  (this->m_oldFunctionBodyMap).m_h1Prime = 0;
  (this->m_oldFunctionBodyMap).m_h2Prime = 0;
  (this->m_oldFunctionBodyMap).m_capacity = 0;
  (this->m_oldFunctionBodyMap).m_hashArray = (Entry *)0x0;
  (this->m_oldFunctionBodyMap).m_count = 0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .buckets = (Type)0x0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .entries = (Type)0x0;
  (this->m_oldObjectMap).m_capacity = 0;
  (this->m_oldInflatePinSet).ptr =
       (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->m_oldObjectMap).m_h1Prime = 0;
  (this->m_oldObjectMap).m_h2Prime = 0;
  (this->m_environmentPinSet).ptr =
       (BaseHashSet<Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::FrameDisplay_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->m_slotArrayPinSet).ptr =
       (BaseHashSet<void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_void_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->m_promiseDataMap).stats = (Type)0x0;
  (this->m_inflatePinSet).ptr =
       (BaseHashSet<Js::RecyclableObject_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::RecyclableObject_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .alloc = &Memory::HeapAllocator::Instance;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .size = 0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .bucketCount = 0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .count = 0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .freeCount = 0;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .modFunctionIndex = 0x4b;
  (this->m_propertyReset).
  super_BaseDictionary<int,_int,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  .stats = (Type)0x0;
  return;
}

Assistant:

InflateMap::InflateMap()
        : m_typeMap(), m_handlerMap(),
        m_tagToGlobalObjectMap(), m_objectMap(),
        m_functionBodyMap(), m_environmentMap(), m_slotArrayMap(), m_promiseDataMap(&HeapAllocator::Instance),
        m_debuggerScopeHomeBodyMap(), m_debuggerScopeChainIndexMap(),
        m_inflatePinSet(), m_environmentPinSet(), m_oldInflatePinSet(),
        m_oldObjectMap(), m_oldFunctionBodyMap(), m_propertyReset(&HeapAllocator::Instance)
    {
        ;
    }